

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_writer.cpp
# Opt level: O2

GeoParquetFileMetadata * __thiscall duckdb::ParquetWriter::GetGeoParquetData(ParquetWriter *this)

{
  _Head_base<0UL,_duckdb::GeoParquetFileMetadata_*,_false> __p;
  pointer in_RAX;
  type pGVar1;
  _Head_base<0UL,_duckdb::GeoParquetFileMetadata_*,_false> local_18;
  
  local_18._M_head_impl = in_RAX;
  if ((this->geoparquet_data).
      super_unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::GeoParquetFileMetadata_*,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
      .super__Head_base<0UL,_duckdb::GeoParquetFileMetadata_*,_false>._M_head_impl ==
      (GeoParquetFileMetadata *)0x0) {
    make_uniq<duckdb::GeoParquetFileMetadata>();
    __p._M_head_impl = local_18._M_head_impl;
    local_18._M_head_impl = (pointer)0x0;
    ::std::
    __uniq_ptr_impl<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
    ::reset((__uniq_ptr_impl<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
             *)&this->geoparquet_data,__p._M_head_impl);
    ::std::
    unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
    ::~unique_ptr((unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
                   *)&local_18);
  }
  pGVar1 = unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
           ::operator*(&this->geoparquet_data);
  return pGVar1;
}

Assistant:

GeoParquetFileMetadata &ParquetWriter::GetGeoParquetData() {
	if (!geoparquet_data) {
		geoparquet_data = make_uniq<GeoParquetFileMetadata>();
	}
	return *geoparquet_data;
}